

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void porter_stemmer(char *zIn,int nIn,char *zOut,int *pnOut)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  char c;
  char *z2;
  char *z;
  char zReverse [28];
  int local_30;
  int local_2c;
  int j;
  int i;
  int *pnOut_local;
  char *zOut_local;
  int nIn_local;
  char *zIn_local;
  
  if ((nIn < 3) || (0x14 < nIn)) {
    copy_stemmer(zIn,nIn,zOut,pnOut);
  }
  else {
    local_30 = 0x16;
    for (local_2c = 0; local_2c < nIn; local_2c = local_2c + 1) {
      cVar1 = zIn[local_2c];
      if ((cVar1 < 'A') || ('Z' < cVar1)) {
        if ((cVar1 < 'a') || ('z' < cVar1)) {
          copy_stemmer(zIn,nIn,zOut,pnOut);
          return;
        }
        zReverse[(long)local_30 + -8] = cVar1;
      }
      else {
        zReverse[(long)local_30 + -8] = cVar1 + ' ';
      }
      local_30 = local_30 + -1;
    }
    memset(zReverse + 0xf,0,5);
    z2 = zReverse + (long)(local_30 + 1) + -8;
    if ((((*z2 == 's') && (iVar3 = stem(&z2,"sess","ss",(_func_int_char_ptr *)0x0), iVar3 == 0)) &&
        (iVar3 = stem(&z2,"sei","i",(_func_int_char_ptr *)0x0), iVar3 == 0)) &&
       (iVar3 = stem(&z2,"ss","ss",(_func_int_char_ptr *)0x0), iVar3 == 0)) {
      z2 = z2 + 1;
    }
    pcVar2 = z2;
    iVar3 = stem(&z2,"dee","ee",m_gt_0);
    if ((((iVar3 == 0) &&
         ((iVar3 = stem(&z2,"gni","",hasVowel), iVar3 != 0 ||
          (iVar3 = stem(&z2,"de","",hasVowel), iVar3 != 0)))) && (z2 != pcVar2)) &&
       (((iVar3 = stem(&z2,"ta","ate",(_func_int_char_ptr *)0x0), iVar3 == 0 &&
         (iVar3 = stem(&z2,"lb","ble",(_func_int_char_ptr *)0x0), iVar3 == 0)) &&
        (iVar3 = stem(&z2,"zi","ize",(_func_int_char_ptr *)0x0), iVar3 == 0)))) {
      iVar3 = doubleConsonant(z2);
      if ((((iVar3 == 0) || (*z2 == 'l')) || (*z2 == 's')) || (*z2 == 'z')) {
        iVar3 = m_eq_1(z2);
        if ((iVar3 != 0) && (iVar3 = star_oh(z2), iVar3 != 0)) {
          z2[-1] = 'e';
          z2 = z2 + -1;
        }
      }
      else {
        z2 = z2 + 1;
      }
    }
    if ((*z2 == 'y') && (iVar3 = hasVowel(z2 + 1), iVar3 != 0)) {
      *z2 = 'i';
    }
    switch(z2[1]) {
    case 'a':
      iVar3 = stem(&z2,"lanoita","ate",m_gt_0);
      if (iVar3 == 0) {
        stem(&z2,"lanoit","tion",m_gt_0);
      }
      break;
    case 'c':
      iVar3 = stem(&z2,"icne","ence",m_gt_0);
      if (iVar3 == 0) {
        stem(&z2,"icna","ance",m_gt_0);
      }
      break;
    case 'e':
      stem(&z2,"rezi","ize",m_gt_0);
      break;
    case 'g':
      stem(&z2,"igol","log",m_gt_0);
      break;
    case 'l':
      iVar3 = stem(&z2,"ilb","ble",m_gt_0);
      if (((iVar3 == 0) && (iVar3 = stem(&z2,"illa","al",m_gt_0), iVar3 == 0)) &&
         ((iVar3 = stem(&z2,"iltne","ent",m_gt_0), iVar3 == 0 &&
          (iVar3 = stem(&z2,"ile","e",m_gt_0), iVar3 == 0)))) {
        stem(&z2,"ilsuo","ous",m_gt_0);
      }
      break;
    case 'o':
      iVar3 = stem(&z2,"noitazi","ize",m_gt_0);
      if ((iVar3 == 0) && (iVar3 = stem(&z2,"noita","ate",m_gt_0), iVar3 == 0)) {
        stem(&z2,"rota","ate",m_gt_0);
      }
      break;
    case 's':
      iVar3 = stem(&z2,"msila","al",m_gt_0);
      if (((iVar3 == 0) && (iVar3 = stem(&z2,"ssenevi","ive",m_gt_0), iVar3 == 0)) &&
         (iVar3 = stem(&z2,"ssenluf","ful",m_gt_0), iVar3 == 0)) {
        stem(&z2,"ssensuo","ous",m_gt_0);
      }
      break;
    case 't':
      iVar3 = stem(&z2,"itila","al",m_gt_0);
      if ((iVar3 == 0) && (iVar3 = stem(&z2,"itivi","ive",m_gt_0), iVar3 == 0)) {
        stem(&z2,"itilib","ble",m_gt_0);
      }
    }
    switch(*z2) {
    case 'e':
      iVar3 = stem(&z2,"etaci","ic",m_gt_0);
      if ((iVar3 == 0) && (iVar3 = stem(&z2,"evita","",m_gt_0), iVar3 == 0)) {
        stem(&z2,"ezila","al",m_gt_0);
      }
      break;
    case 'i':
      stem(&z2,"itici","ic",m_gt_0);
      break;
    case 'l':
      iVar3 = stem(&z2,"laci","ic",m_gt_0);
      if (iVar3 == 0) {
        stem(&z2,"luf","",m_gt_0);
      }
      break;
    case 's':
      stem(&z2,"ssen","",m_gt_0);
    }
    switch(z2[1]) {
    case 'a':
      if ((*z2 == 'l') && (iVar3 = m_gt_1(z2 + 2), iVar3 != 0)) {
        z2 = z2 + 2;
      }
      break;
    case 'c':
      if ((((*z2 == 'e') && (z2[2] == 'n')) && ((z2[3] == 'a' || (z2[3] == 'e')))) &&
         (iVar3 = m_gt_1(z2 + 4), iVar3 != 0)) {
        z2 = z2 + 4;
      }
      break;
    case 'e':
      if ((*z2 == 'r') && (iVar3 = m_gt_1(z2 + 2), iVar3 != 0)) {
        z2 = z2 + 2;
      }
      break;
    case 'i':
      if ((*z2 == 'c') && (iVar3 = m_gt_1(z2 + 2), iVar3 != 0)) {
        z2 = z2 + 2;
      }
      break;
    case 'l':
      if ((((*z2 == 'e') && (z2[2] == 'b')) && ((z2[3] == 'a' || (z2[3] == 'i')))) &&
         (iVar3 = m_gt_1(z2 + 4), iVar3 != 0)) {
        z2 = z2 + 4;
      }
      break;
    case 'n':
      if (*z2 == 't') {
        if (z2[2] == 'a') {
          iVar3 = m_gt_1(z2 + 3);
          if (iVar3 != 0) {
            z2 = z2 + 3;
          }
        }
        else if (((z2[2] == 'e') && (iVar3 = stem(&z2,"tneme","",m_gt_1), iVar3 == 0)) &&
                (iVar3 = stem(&z2,"tnem","",m_gt_1), iVar3 == 0)) {
          stem(&z2,"tne","",m_gt_1);
        }
      }
      break;
    case 'o':
      if (*z2 == 'u') {
        iVar3 = m_gt_1(z2 + 2);
        if (iVar3 != 0) {
          z2 = z2 + 2;
        }
      }
      else if ((z2[3] == 's') || (z2[3] == 't')) {
        stem(&z2,"noi","",m_gt_1);
      }
      break;
    case 's':
      if (((*z2 == 'm') && (z2[2] == 'i')) && (iVar3 = m_gt_1(z2 + 3), iVar3 != 0)) {
        z2 = z2 + 3;
      }
      break;
    case 't':
      iVar3 = stem(&z2,"eta","",m_gt_1);
      if (iVar3 == 0) {
        stem(&z2,"iti","",m_gt_1);
      }
      break;
    case 'u':
      if (((*z2 == 's') && (z2[2] == 'o')) && (iVar3 = m_gt_1(z2 + 3), iVar3 != 0)) {
        z2 = z2 + 3;
      }
      break;
    case 'v':
    case 'z':
      if (((*z2 == 'e') && (z2[2] == 'i')) && (iVar3 = m_gt_1(z2 + 3), iVar3 != 0)) {
        z2 = z2 + 3;
      }
    }
    if (*z2 == 'e') {
      iVar3 = m_gt_1(z2 + 1);
      if (iVar3 == 0) {
        iVar3 = m_eq_1(z2 + 1);
        if ((iVar3 != 0) && (iVar3 = star_oh(z2 + 1), iVar3 == 0)) {
          z2 = z2 + 1;
        }
      }
      else {
        z2 = z2 + 1;
      }
    }
    iVar3 = m_gt_1(z2);
    if (((iVar3 != 0) && (*z2 == 'l')) && (z2[1] == 'l')) {
      z2 = z2 + 1;
    }
    sVar4 = strlen(z2);
    local_2c = (int)sVar4;
    *pnOut = local_2c;
    zOut[local_2c] = '\0';
    while (*z2 != '\0') {
      local_2c = local_2c + -1;
      zOut[local_2c] = *z2;
      z2 = z2 + 1;
    }
  }
  return;
}

Assistant:

static void porter_stemmer(const char *zIn, int nIn, char *zOut, int *pnOut){
  int i, j;
  char zReverse[28];
  char *z, *z2;
  if( nIn<3 || nIn>=(int)sizeof(zReverse)-7 ){
    /* The word is too big or too small for the porter stemmer.
    ** Fallback to the copy stemmer */
    copy_stemmer(zIn, nIn, zOut, pnOut);
    return;
  }
  for(i=0, j=sizeof(zReverse)-6; i<nIn; i++, j--){
    char c = zIn[i];
    if( c>='A' && c<='Z' ){
      zReverse[j] = c + 'a' - 'A';
    }else if( c>='a' && c<='z' ){
      zReverse[j] = c;
    }else{
      /* The use of a character not in [a-zA-Z] means that we fallback
      ** to the copy stemmer */
      copy_stemmer(zIn, nIn, zOut, pnOut);
      return;
    }
  }
  memset(&zReverse[sizeof(zReverse)-5], 0, 5);
  z = &zReverse[j+1];


  /* Step 1a */
  if( z[0]=='s' ){
    if(
     !stem(&z, "sess", "ss", 0) &&
     !stem(&z, "sei", "i", 0)  &&
     !stem(&z, "ss", "ss", 0)
    ){
      z++;
    }
  }

  /* Step 1b */  
  z2 = z;
  if( stem(&z, "dee", "ee", m_gt_0) ){
    /* Do nothing.  The work was all in the test */
  }else if( 
     (stem(&z, "gni", "", hasVowel) || stem(&z, "de", "", hasVowel))
      && z!=z2
  ){
     if( stem(&z, "ta", "ate", 0) ||
         stem(&z, "lb", "ble", 0) ||
         stem(&z, "zi", "ize", 0) ){
       /* Do nothing.  The work was all in the test */
     }else if( doubleConsonant(z) && (*z!='l' && *z!='s' && *z!='z') ){
       z++;
     }else if( m_eq_1(z) && star_oh(z) ){
       *(--z) = 'e';
     }
  }

  /* Step 1c */
  if( z[0]=='y' && hasVowel(z+1) ){
    z[0] = 'i';
  }

  /* Step 2 */
  switch( z[1] ){
   case 'a':
     if( !stem(&z, "lanoita", "ate", m_gt_0) ){
       stem(&z, "lanoit", "tion", m_gt_0);
     }
     break;
   case 'c':
     if( !stem(&z, "icne", "ence", m_gt_0) ){
       stem(&z, "icna", "ance", m_gt_0);
     }
     break;
   case 'e':
     stem(&z, "rezi", "ize", m_gt_0);
     break;
   case 'g':
     stem(&z, "igol", "log", m_gt_0);
     break;
   case 'l':
     if( !stem(&z, "ilb", "ble", m_gt_0) 
      && !stem(&z, "illa", "al", m_gt_0)
      && !stem(&z, "iltne", "ent", m_gt_0)
      && !stem(&z, "ile", "e", m_gt_0)
     ){
       stem(&z, "ilsuo", "ous", m_gt_0);
     }
     break;
   case 'o':
     if( !stem(&z, "noitazi", "ize", m_gt_0)
      && !stem(&z, "noita", "ate", m_gt_0)
     ){
       stem(&z, "rota", "ate", m_gt_0);
     }
     break;
   case 's':
     if( !stem(&z, "msila", "al", m_gt_0)
      && !stem(&z, "ssenevi", "ive", m_gt_0)
      && !stem(&z, "ssenluf", "ful", m_gt_0)
     ){
       stem(&z, "ssensuo", "ous", m_gt_0);
     }
     break;
   case 't':
     if( !stem(&z, "itila", "al", m_gt_0)
      && !stem(&z, "itivi", "ive", m_gt_0)
     ){
       stem(&z, "itilib", "ble", m_gt_0);
     }
     break;
  }

  /* Step 3 */
  switch( z[0] ){
   case 'e':
     if( !stem(&z, "etaci", "ic", m_gt_0)
      && !stem(&z, "evita", "", m_gt_0)
     ){
       stem(&z, "ezila", "al", m_gt_0);
     }
     break;
   case 'i':
     stem(&z, "itici", "ic", m_gt_0);
     break;
   case 'l':
     if( !stem(&z, "laci", "ic", m_gt_0) ){
       stem(&z, "luf", "", m_gt_0);
     }
     break;
   case 's':
     stem(&z, "ssen", "", m_gt_0);
     break;
  }

  /* Step 4 */
  switch( z[1] ){
   case 'a':
     if( z[0]=='l' && m_gt_1(z+2) ){
       z += 2;
     }
     break;
   case 'c':
     if( z[0]=='e' && z[2]=='n' && (z[3]=='a' || z[3]=='e')  && m_gt_1(z+4)  ){
       z += 4;
     }
     break;
   case 'e':
     if( z[0]=='r' && m_gt_1(z+2) ){
       z += 2;
     }
     break;
   case 'i':
     if( z[0]=='c' && m_gt_1(z+2) ){
       z += 2;
     }
     break;
   case 'l':
     if( z[0]=='e' && z[2]=='b' && (z[3]=='a' || z[3]=='i') && m_gt_1(z+4) ){
       z += 4;
     }
     break;
   case 'n':
     if( z[0]=='t' ){
       if( z[2]=='a' ){
         if( m_gt_1(z+3) ){
           z += 3;
         }
       }else if( z[2]=='e' ){
         if( !stem(&z, "tneme", "", m_gt_1)
          && !stem(&z, "tnem", "", m_gt_1)
         ){
           stem(&z, "tne", "", m_gt_1);
         }
       }
     }
     break;
   case 'o':
     if( z[0]=='u' ){
       if( m_gt_1(z+2) ){
         z += 2;
       }
     }else if( z[3]=='s' || z[3]=='t' ){
       stem(&z, "noi", "", m_gt_1);
     }
     break;
   case 's':
     if( z[0]=='m' && z[2]=='i' && m_gt_1(z+3) ){
       z += 3;
     }
     break;
   case 't':
     if( !stem(&z, "eta", "", m_gt_1) ){
       stem(&z, "iti", "", m_gt_1);
     }
     break;
   case 'u':
     if( z[0]=='s' && z[2]=='o' && m_gt_1(z+3) ){
       z += 3;
     }
     break;
   case 'v':
   case 'z':
     if( z[0]=='e' && z[2]=='i' && m_gt_1(z+3) ){
       z += 3;
     }
     break;
  }

  /* Step 5a */
  if( z[0]=='e' ){
    if( m_gt_1(z+1) ){
      z++;
    }else if( m_eq_1(z+1) && !star_oh(z+1) ){
      z++;
    }
  }

  /* Step 5b */
  if( m_gt_1(z) && z[0]=='l' && z[1]=='l' ){
    z++;
  }

  /* z[] is now the stemmed word in reverse order.  Flip it back
  ** around into forward order and return.
  */
  *pnOut = i = (int)strlen(z);
  zOut[i] = 0;
  while( *z ){
    zOut[--i] = *(z++);
  }
}